

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

void Llb_MnxCheckNextStateVars(Llb_Mnx_t *p)

{
  Aig_Man_t *pAVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  pAVar1 = p->pAig;
  lVar6 = (long)pAVar1->nRegs;
  if (lVar6 < 1) {
    uVar3 = 0;
    uVar4 = 0;
  }
  else {
    uVar8 = (ulong)(uint)pAVar1->nTruePos;
    uVar4 = 0;
    uVar3 = 0;
    lVar7 = lVar6;
    do {
      if ((pAVar1->nTruePos < 0) || (pAVar1->vCos->nSize <= (int)uVar8)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      uVar2 = *(ulong *)((long)pAVar1->vCos->pArray[uVar8] + 8);
      piVar5 = (int *)(uVar2 & 0xfffffffffffffffe);
      if (((piVar5[6] & 7U) == 2) && (pAVar1->nTruePis <= *piVar5)) {
        if ((uVar2 & 1) == 0) {
          uVar4 = (ulong)((int)uVar4 + 1);
        }
        else {
          uVar3 = (ulong)((int)uVar3 + 1);
        }
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
  }
  printf("Total = %d.  Direct LO = %d. Compl LO = %d.\n",lVar6,uVar4,uVar3);
  return;
}

Assistant:

void Llb_MnxCheckNextStateVars( Llb_Mnx_t * p )
{
    Aig_Obj_t * pObj;
    int i, Counter0 = 0, Counter1 = 0;
    Saig_ManForEachLi( p->pAig, pObj, i )
        if ( Saig_ObjIsLo(p->pAig, Aig_ObjFanin0(pObj)) )
        {
            if ( Aig_ObjFaninC0(pObj) )
                Counter0++;
            else
                Counter1++;
        }
    printf( "Total = %d.  Direct LO = %d. Compl LO = %d.\n", Aig_ManRegNum(p->pAig), Counter1, Counter0 );
}